

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O3

void __thiscall
chrono::ChDiscreteDistribution::ChDiscreteDistribution
          (ChDiscreteDistribution *this,ChVectorDynamic<> *mx,ChVectorDynamic<> *my)

{
  ChVectorDynamic<> *this_00;
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Index index;
  ulong uVar19;
  ChException *this_01;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  undefined1 auVar28 [16];
  string local_50;
  
  (this->super_ChDistribution)._vptr_ChDistribution =
       (_func_int **)&PTR__ChDiscreteDistribution_00b03398;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->x,(DenseStorage<double,__1,__1,_1,_0> *)mx
            );
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->y,(DenseStorage<double,__1,__1,_1,_0> *)my
            );
  this_00 = &this->cdf_y;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  uVar3 = (mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar3 != (my->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
     ) {
    this_01 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Probability values and percentages must have the same size","");
    ChException::ChException(this_01,&local_50);
    __cxa_throw(this_01,&ChException::typeinfo,ChException::~ChException);
  }
  pdVar4 = (my->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (uVar3 == 0) {
    uVar19 = 0;
    pdVar20 = (double *)0x0;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar3,1);
    if ((this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar3) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar20 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar19 = uVar3 + 7;
    if (-1 < (long)uVar3) {
      uVar19 = uVar3;
    }
    uVar19 = uVar19 & 0xfffffffffffffff8;
    if (7 < (long)uVar3) {
      lVar21 = 0;
      do {
        pdVar2 = pdVar4 + lVar21;
        dVar27 = pdVar2[1];
        dVar13 = pdVar2[2];
        dVar14 = pdVar2[3];
        dVar15 = pdVar2[4];
        dVar16 = pdVar2[5];
        dVar17 = pdVar2[6];
        dVar18 = pdVar2[7];
        pdVar1 = pdVar20 + lVar21;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar27;
        pdVar1[2] = dVar13;
        pdVar1[3] = dVar14;
        pdVar1[4] = dVar15;
        pdVar1[5] = dVar16;
        pdVar1[6] = dVar17;
        pdVar1[7] = dVar18;
        lVar21 = lVar21 + 8;
      } while (lVar21 < (long)uVar19);
    }
  }
  if ((long)uVar19 < (long)uVar3) {
    do {
      pdVar20[uVar19] = pdVar4[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar3 != uVar19);
  }
  uVar3 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (0 < (long)uVar3) {
    uVar19 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar5 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar4 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pdVar20 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_data;
    dVar27 = 0.0;
    uVar22 = 0;
    do {
      if (((~((long)uVar19 >> 0x3f) & uVar19) == uVar22) ||
         ((~((long)uVar5 >> 0x3f) & uVar5) == uVar22)) goto LAB_004f7e8f;
      dVar27 = dVar27 + pdVar4[uVar22];
      pdVar20[uVar22] = dVar27;
      uVar22 = uVar22 + 1;
    } while (uVar3 != uVar22);
    if ((long)uVar3 <=
        (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows) {
      pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      dVar27 = pdVar4[uVar3 - 1];
      if ((dVar27 != 1.0) || (NAN(dVar27))) {
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar28._0_8_ = 1.0 / dVar27;
        auVar28._8_8_ = 0;
        auVar24 = vpbroadcastq_avx512f();
        uVar19 = 0;
        auVar25 = vbroadcastsd_avx512f(auVar28);
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar26,auVar23);
          uVar5 = vpcmpuq_avx512f(auVar26,auVar24,2);
          pdVar20 = pdVar4 + uVar19;
          auVar26._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * (long)pdVar20[1];
          auVar26._0_8_ = (ulong)((byte)uVar5 & 1) * (long)*pdVar20;
          auVar26._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * (long)pdVar20[2];
          auVar26._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * (long)pdVar20[3];
          auVar26._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * (long)pdVar20[4];
          auVar26._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * (long)pdVar20[5];
          auVar26._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * (long)pdVar20[6];
          auVar26._56_8_ = (uVar5 >> 7) * (long)pdVar20[7];
          auVar26 = vmulpd_avx512f(auVar25,auVar26);
          pdVar20 = pdVar4 + uVar19;
          bVar6 = (bool)((byte)uVar5 & 1);
          bVar7 = (bool)((byte)(uVar5 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar5 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar5 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar5 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar5 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar5 >> 6) & 1);
          *pdVar20 = (double)((ulong)bVar6 * auVar26._0_8_ | (ulong)!bVar6 * (long)*pdVar20);
          pdVar20[1] = (double)((ulong)bVar7 * auVar26._8_8_ | (ulong)!bVar7 * (long)pdVar20[1]);
          pdVar20[2] = (double)((ulong)bVar8 * auVar26._16_8_ | (ulong)!bVar8 * (long)pdVar20[2]);
          pdVar20[3] = (double)((ulong)bVar9 * auVar26._24_8_ | (ulong)!bVar9 * (long)pdVar20[3]);
          pdVar20[4] = (double)((ulong)bVar10 * auVar26._32_8_ | (ulong)!bVar10 * (long)pdVar20[4]);
          pdVar20[5] = (double)((ulong)bVar11 * auVar26._40_8_ | (ulong)!bVar11 * (long)pdVar20[5]);
          pdVar20[6] = (double)((ulong)bVar12 * auVar26._48_8_ | (ulong)!bVar12 * (long)pdVar20[6]);
          pdVar20[7] = (double)((uVar5 >> 7) * auVar26._56_8_ |
                               (ulong)!SUB81(uVar5 >> 7,0) * (long)pdVar20[7]);
          uVar19 = uVar19 + 8;
        } while ((uVar3 + 7 & 0xfffffffffffffff8) != uVar19);
      }
      pdVar4[uVar3 - 1] = 1.0;
      return;
    }
  }
LAB_004f7e8f:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

ChDiscreteDistribution::ChDiscreteDistribution(ChVectorDynamic<>& mx, ChVectorDynamic<>& my) : x(mx), y(my) {
    if (mx.size() != my.size())
        throw ChException("Probability values and percentages must have the same size");

    cdf_y = my;

    // compute CDF
    double integral = 0;
    for (int i = 0; i < x.size(); i++) {
        integral += y(i);
        cdf_y(i) = integral;
    }
    // normalize if P(x) had not unit integral
    double totintegral = cdf_y(x.size() - 1);
    if (totintegral != 1.0) {
        for (int i = 0; i < x.size(); i++) {
            cdf_y(i) *= 1. / totintegral;
        }
    }
    cdf_y(x.size() - 1) = 1.0;
}